

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  uint uVar1;
  Db *pDVar2;
  char *zRight;
  int iVar3;
  HashElem *pHVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = db->nDb;
  do {
    if (0 < (int)uVar1) {
      pDVar2 = db->aDb;
      uVar6 = 0;
      do {
        uVar5 = uVar6 < 2 ^ uVar6;
        if ((zDatabase == (char *)0x0) ||
           (iVar3 = sqlite3StrICmp(zDatabase,pDVar2[uVar5].zDbSName), iVar3 == 0)) {
          pHVar4 = findElementWithHash(&(pDVar2[uVar5].pSchema)->tblHash,zName,(uint *)0x0);
          if ((Table *)pHVar4->data != (Table *)0x0) {
            return (Table *)pHVar4->data;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    iVar3 = sqlite3StrICmp(zName,"sqlite_master");
    if (iVar3 != 0) {
      return (Table *)0x0;
    }
    zRight = db->aDb[1].zDbSName;
    if (zDatabase == (char *)0x0) {
      iVar3 = -(uint)(zRight != (char *)0x0);
    }
    else {
      if (zRight == (char *)0x0) {
        return (Table *)0x0;
      }
      iVar3 = sqlite3StrICmp(zDatabase,zRight);
    }
    zName = "sqlite_temp_master";
  } while (iVar3 == 0);
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}